

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::softmax(Model *this,int32_t target,real lr)

{
  real *prVar1;
  real in_ESI;
  Model *in_RDI;
  float in_XMM0_Da;
  Vector *unaff_retaddr;
  real alpha;
  real label;
  int32_t i;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  Vector *in_stack_ffffffffffffffc0;
  real a;
  Vector *in_stack_ffffffffffffffd0;
  double dVar2;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar3;
  real a_00;
  float fVar4;
  Model *A;
  
  A = in_RDI;
  Vector::zero(in_stack_ffffffffffffffd0);
  computeOutputSoftmax((Model *)0x1915d3);
  for (a_00 = 0.0; (int)a_00 < in_RDI->osz_; a_00 = (real)((int)a_00 + 1)) {
    a = 0.0;
    dVar2 = 1.0;
    if (a_00 != in_ESI) {
      dVar2 = 0.0;
    }
    in_stack_ffffffffffffffb8 = (float)dVar2;
    fVar4 = in_XMM0_Da;
    prVar1 = Vector::operator[](in_stack_ffffffffffffffc0,
                                CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffb8));
    fVar3 = in_XMM0_Da * (in_stack_ffffffffffffffb8 - *prVar1);
    in_stack_ffffffffffffffc0 = &in_RDI->grad_;
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffffc0);
    Vector::addRow(unaff_retaddr,(Matrix *)A,CONCAT44(in_ESI,fVar4),a_00);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1916b5);
    Matrix::addRow((Matrix *)CONCAT44(fVar3,in_stack_ffffffffffffffe0),(Vector *)in_RDI,
                   (int64_t)dVar2,a);
    in_stack_ffffffffffffffbc = in_XMM0_Da;
    in_XMM0_Da = fVar4;
  }
  prVar1 = Vector::operator[](in_stack_ffffffffffffffc0,
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  dVar2 = log(in_RDI,(double)(ulong)(uint)*prVar1);
  return -SUB84(dVar2,0);
}

Assistant:

real Model::softmax(int32_t target, real lr) {
	grad_.zero();
	computeOutputSoftmax();
	for (int32_t i = 0; i < osz_; i++) {
		real label = (i == target) ? 1.0 : 0.0;
		real alpha = lr * (label - output_[i]);
		grad_.addRow(*wo_, i, alpha);
		wo_->addRow(hidden_, i, alpha);
	}
	return -log(output_[target]);
}